

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void Curl_expire_clear(Curl_easy *data)

{
  Curl_multi *pCVar1;
  uint uVar2;
  
  pCVar1 = data->multi;
  if ((pCVar1 != (Curl_multi *)0x0) &&
     (((data->state).expiretime.tv_sec != 0 || ((data->state).expiretime.tv_usec != 0)))) {
    uVar2 = Curl_splayremovebyaddr(pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
    if (uVar2 != 0) {
      Curl_infof(data,"Internal error clearing splay node = %d\n",(ulong)uVar2);
    }
    if ((data->state).timeoutlist.size != 0) {
      do {
        Curl_llist_remove(&(data->state).timeoutlist,(data->state).timeoutlist.tail,(void *)0x0);
      } while ((data->state).timeoutlist.size != 0);
    }
    (data->state).expiretime.tv_sec = 0;
    (data->state).expiretime.tv_usec = 0;
  }
  return;
}

Assistant:

void Curl_expire_clear(struct Curl_easy *data)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *nowp = &data->state.expiretime;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  if(nowp->tv_sec || nowp->tv_usec) {
    /* Since this is an cleared time, we must remove the previous entry from
       the splay tree */
    struct curl_llist *list = &data->state.timeoutlist;
    int rc;

    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error clearing splay node = %d\n", rc);

    /* flush the timeout list too */
    while(list->size > 0) {
      Curl_llist_remove(list, list->tail, NULL);
    }

#ifdef DEBUGBUILD
    infof(data, "Expire cleared (transfer %p)\n", data);
#endif
    nowp->tv_sec = 0;
    nowp->tv_usec = 0;
  }
}